

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ec_asn1.cc
# Opt level: O0

int EC_POINT_point2cbb(CBB *out,EC_GROUP *group,EC_POINT *point,point_conversion_form_t form,
                      BN_CTX *ctx)

{
  int iVar1;
  uint8_t *puVar2;
  bool local_49;
  uchar *local_48;
  uint8_t *p;
  size_t len;
  BN_CTX *ctx_local;
  EC_POINT *pEStack_28;
  point_conversion_form_t form_local;
  EC_POINT *point_local;
  EC_GROUP *group_local;
  CBB *out_local;
  
  len = (size_t)ctx;
  ctx_local._4_4_ = form;
  pEStack_28 = point;
  point_local = (EC_POINT *)group;
  group_local = (EC_GROUP *)out;
  p = (uint8_t *)
      EC_POINT_point2oct((EC_GROUP *)group,(EC_POINT *)point,form,(uchar *)0x0,0,(BN_CTX *)ctx);
  if (p == (uint8_t *)0x0) {
    out_local._4_4_ = 0;
  }
  else {
    iVar1 = CBB_add_space((CBB *)group_local,&local_48,(size_t)p);
    local_49 = false;
    if (iVar1 != 0) {
      puVar2 = (uint8_t *)
               EC_POINT_point2oct((EC_GROUP *)point_local,(EC_POINT *)pEStack_28,ctx_local._4_4_,
                                  local_48,(size_t)p,(BN_CTX *)len);
      local_49 = puVar2 == p;
    }
    out_local._4_4_ = (uint)local_49;
  }
  return out_local._4_4_;
}

Assistant:

int EC_POINT_point2cbb(CBB *out, const EC_GROUP *group, const EC_POINT *point,
                       point_conversion_form_t form, BN_CTX *ctx) {
  size_t len = EC_POINT_point2oct(group, point, form, NULL, 0, ctx);
  if (len == 0) {
    return 0;
  }
  uint8_t *p;
  return CBB_add_space(out, &p, len) &&
         EC_POINT_point2oct(group, point, form, p, len, ctx) == len;
}